

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

mat4 * __thiscall Camera::get_projection(mat4 *__return_storage_ptr__,Camera *this,float aspect)

{
  glm::perspectiveRH_NO<float>
            (__return_storage_ptr__,this->FoV * 0.017453292,aspect,this->z_near,this->z_far);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::get_projection(float aspect) {
    // std::cout << FoV << std::endl;
    return glm::perspective(
        glm::radians(FoV),
        aspect,
        z_near,
        z_far
    );
}